

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void gai_mem_copy(int elemsize,int ndim,void *src_ptr,Integer *src_start,Integer *count,
                 Integer *src_ld,void *dst_ptr,Integer *dst_start,Integer *dst_ld)

{
  Integer IVar1;
  ulong uVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  void *local_118;
  void *local_110;
  int aiStack_f8 [2];
  undefined1 local_f0 [24];
  int aiStack_d8 [2];
  undefined1 local_d0 [24];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  local_118 = dst_ptr;
  uVar9 = (ulong)(uint)ndim;
  local_110 = src_ptr;
  if (ndim < 1) {
LAB_00177d6b:
    iVar4 = (int)*count;
  }
  else {
    uVar2 = (ulong)(ndim - 1);
    uVar5 = 0;
    lVar10 = 0;
    lVar11 = 1;
    do {
      lVar7 = lVar11;
      if (uVar5 < uVar2) {
        lVar7 = src_ld[uVar5] * lVar11;
      }
      lVar10 = lVar10 + lVar11 * src_start[uVar5];
      uVar5 = uVar5 + 1;
      lVar11 = lVar7;
    } while (uVar9 != uVar5);
    local_110 = (void *)((long)src_ptr + lVar10 * elemsize);
    if (ndim < 1) goto LAB_00177d6b;
    uVar5 = 0;
    lVar10 = 0;
    lVar11 = 1;
    do {
      lVar7 = lVar11;
      if (uVar5 < uVar2) {
        lVar7 = dst_ld[uVar5] * lVar11;
      }
      lVar10 = lVar10 + lVar11 * dst_start[uVar5];
      uVar5 = uVar5 + 1;
      lVar11 = lVar7;
    } while (uVar9 != uVar5);
    local_118 = (void *)((long)dst_ptr + lVar10 * elemsize);
    iVar4 = (int)*count;
    iVar8 = 1;
    bVar12 = ndim != 1;
    if (bVar12) {
      uVar5 = 0;
      iVar6 = elemsize;
      iVar3 = elemsize;
      do {
        iVar6 = iVar6 * (int)src_ld[uVar5];
        aiStack_58[uVar5 + 1] = iVar6;
        iVar3 = iVar3 * (int)dst_ld[uVar5];
        aiStack_78[uVar5 + 1] = iVar3;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      if (ndim == 1) {
        bVar12 = false;
      }
      else {
        iVar8 = 1;
        uVar2 = 1;
        do {
          iVar8 = iVar8 * (int)count[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar9 != uVar2);
      }
      goto LAB_00177d77;
    }
  }
  iVar8 = 1;
  bVar12 = false;
LAB_00177d77:
  aiStack_d8[1] = 0;
  iVar6 = 1;
  aiStack_98[1] = 1;
  aiStack_f8[1] = 0;
  aiStack_b8[1] = 1;
  if (2 < ndim) {
    __n = (ulong)(ndim - 2) << 2;
    lVar11 = 0;
    memset(local_d0,0,__n);
    memset(local_f0,0,__n);
    iVar3 = 1;
    do {
      IVar1 = count[lVar11 + 1];
      iVar3 = iVar3 * (int)IVar1;
      aiStack_98[lVar11 + 2] = iVar3;
      iVar6 = iVar6 * (int)IVar1;
      aiStack_b8[lVar11 + 2] = iVar6;
      lVar11 = lVar11 + 1;
    } while (uVar9 - 2 != lVar11);
  }
  if (0 < iVar8) {
    iVar6 = 0;
    do {
      if (bVar12) {
        uVar2 = 1;
        lVar11 = 0;
        do {
          lVar11 = lVar11 + (long)aiStack_58[uVar2] * (long)aiStack_d8[uVar2];
          lVar10 = (long)aiStack_d8[uVar2] + (ulong)((iVar6 + 1) % aiStack_98[uVar2] == 0);
          iVar3 = 0;
          if (lVar10 < count[uVar2]) {
            iVar3 = (int)lVar10;
          }
          aiStack_d8[uVar2] = iVar3;
          uVar2 = uVar2 + 1;
        } while (uVar9 != uVar2);
        if (!bVar12) goto LAB_00177ea8;
        uVar2 = 1;
        lVar10 = 0;
        do {
          lVar10 = lVar10 + (long)aiStack_78[uVar2] * (long)aiStack_f8[uVar2];
          lVar7 = (long)aiStack_f8[uVar2] + (ulong)((iVar6 + 1) % aiStack_b8[uVar2] == 0);
          iVar3 = 0;
          if (lVar7 < count[uVar2]) {
            iVar3 = (int)lVar7;
          }
          aiStack_f8[uVar2] = iVar3;
          uVar2 = uVar2 + 1;
        } while (uVar9 != uVar2);
      }
      else {
        lVar11 = 0;
LAB_00177ea8:
        lVar10 = 0;
      }
      iVar6 = iVar6 + 1;
      memcpy((void *)(lVar10 + (long)local_118),(void *)(lVar11 + (long)local_110),
             (long)(iVar4 * elemsize));
    } while (iVar6 != iVar8);
  }
  return;
}

Assistant:

void gai_mem_copy(int elemsize, int ndim, void *src_ptr, Integer *src_start,
    Integer *count,  Integer *src_ld, void *dst_ptr, Integer *dst_start,
    Integer *dst_ld)
{
  Integer src_offset, dst_offset;
  Integer factor;
  void *sptr, *dptr;
  int i, j;
  long src_idx, dst_idx;
  int n1dim; /* total number of contiguous segments */
  int src_bvalue[MAXDIM], src_bunit[MAXDIM];
  int dst_bvalue[MAXDIM], dst_bunit[MAXDIM];
  int src_stride[MAXDIM], dst_stride[MAXDIM];
  int segsize;
  /* find offsets for both source and destination buffers and use these to
   * adjust pointers to the first element in each data set
   */
  factor = 1;
  src_offset = 0;
  for (i=0; i<ndim; i++) {
    src_offset += src_start[i]*factor;
    if (i<ndim-1) factor *= src_ld[i];
  }
  sptr = (void*)((char*)src_ptr+src_offset*elemsize);

  factor = 1; //reset the factor

  dst_offset = 0;
  for (i=0; i<ndim; i++) {
    dst_offset += dst_start[i]*factor;
    if (i<ndim-1) factor *= dst_ld[i];
  }
  dptr = (void*)((char*)dst_ptr+dst_offset*elemsize);
  segsize = count[0]*elemsize;
  /* perform the memcpy from source to destination buffer. Start by calculating
   * the total number of contiguous segments in the src array*/
  n1dim = 1;

  src_stride[0] = dst_stride[0] = elemsize;
  for (i=0; i<ndim-1; i++) {
    src_stride[i+1] = src_stride[i];
    src_stride[i+1] *= (int)src_ld[i];
    dst_stride[i+1] = dst_stride[i];
    dst_stride[i+1] *= (int)dst_ld[i];
  }

  for (i=1; i<=ndim-1; i++) {
    n1dim *= count[i];
  }
  /* initialize arrays for evaluating offset of each segment */
  src_bvalue[0] = 0;
  src_bvalue[1] = 0;
  src_bunit[0] = 1;
  src_bunit[1] = 1;
  dst_bvalue[0] = 0;
  dst_bvalue[1] = 0;
  dst_bunit[0] = 1;
  dst_bunit[1] = 1;

  //this part does nothing?
  for (i=2; i<=ndim-1; i++) {
    src_bvalue[i] = 0;
    dst_bvalue[i] = 0;
    src_bunit[i] = src_bunit[i-1]*count[i-1];
    dst_bunit[i] = dst_bunit[i-1]*count[i-1];
  }

  /* evaluate offset for each contiguous segment */
  for (i=0; i<n1dim; i++) {
    src_idx = 0;
    dst_idx = 0;
    for (j=1; j<=ndim-1; j++) {
      src_idx += src_bvalue[j]*src_stride[j];
      if ((i+1)%src_bunit[j] == 0) {
        src_bvalue[j]++;
      }
      if (src_bvalue[j] > (count[j]-1)) {
        src_bvalue[j] = 0;
      }
    }
    for (j=1; j<=ndim-1; j++) {
      dst_idx += dst_bvalue[j]*dst_stride[j];
      if ((i+1)%dst_bunit[j] == 0) {
        dst_bvalue[j]++;
      }
      if (dst_bvalue[j] > (count[j]-1)) {
        dst_bvalue[j] = 0;
      }
    }
    /* copy memory */
    memcpy((char*)dptr+dst_idx,(char*)sptr+src_idx,segsize);
  }
}